

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O2

s32 __thiscall irr::gui::CGUIFont::getCharacterFromPos(CGUIFont *this,wchar_t *text,s32 pixel_x)

{
  pointer pSVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  iVar3 = -1;
  do {
    if (*text == L'\0') {
      return -1;
    }
    uVar2 = getAreaFromCharacter(this,*text);
    pSVar1 = (this->Areas).m_data.
             super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = iVar4 + pSVar1[uVar2].width + pSVar1[uVar2].overhang + pSVar1[uVar2].underhang +
            this->GlobalKerningWidth;
    iVar3 = iVar3 + 1;
    text = text + 1;
  } while (iVar4 < pixel_x);
  return iVar3;
}

Assistant:

s32 CGUIFont::getCharacterFromPos(const wchar_t *text, s32 pixel_x) const
{
	s32 x = 0;
	s32 idx = 0;

	while (text[idx]) {
		const SFontArea &a = Areas[getAreaFromCharacter(text[idx])];

		x += a.width + a.overhang + a.underhang + GlobalKerningWidth;

		if (x >= pixel_x)
			return idx;

		++idx;
	}

	return -1;
}